

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O1

string * __thiscall
Diligent::LinuxFileSystem::GetLocalAppDataDirectory_abi_cxx11_
          (string *__return_storage_ptr__,LinuxFileSystem *this,char *AppName,bool Create)

{
  char cVar1;
  bool bVar2;
  __uid_t __uid;
  passwd *ppVar3;
  allocator local_19;
  
  __uid = getuid();
  ppVar3 = getpwuid(__uid);
  std::__cxx11::string::string((string *)__return_storage_ptr__,ppVar3->pw_dir,&local_19);
  cVar1 = (__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1];
  if ((cVar1 != '/') && (cVar1 != '\\')) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (this == (LinuxFileSystem *)0x0) {
    this = _program_invocation_short_name;
  }
  if (this != (LinuxFileSystem *)0x0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((char)AppName != '\0') {
      bVar2 = PathExists((__return_storage_ptr__->_M_dataplus)._M_p);
      if (!bVar2) {
        CreateDirectory((__return_storage_ptr__->_M_dataplus)._M_p);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LinuxFileSystem::GetLocalAppDataDirectory(const char* AppName, bool Create)
{
    const auto* pwuid = getpwuid(getuid());
    std::string AppDataDir{pwuid->pw_dir};
    if (!IsSlash(AppDataDir.back()))
        AppDataDir += SlashSymbol;

#    if PLATFORM_APPLE
    AppDataDir += "Library/Caches";
#    else
    AppDataDir += ".cache";
#    endif

    if (AppName == nullptr)
    {
#    ifdef _GNU_SOURCE
        AppName = program_invocation_short_name;
#    elif defined(__APPLE__)
        AppName = getprogname();
#    endif
    }

    if (AppName != nullptr)
    {
        AppDataDir += SlashSymbol;
        AppDataDir += AppName;
        if (Create && !PathExists(AppDataDir.c_str()))
            CreateDirectory(AppDataDir.c_str());
    }
    return AppDataDir;
}